

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int iter_aux(lua_State *L)

{
  long lVar1;
  char *pcVar2;
  char *next;
  long lStack_30;
  int code;
  lua_Integer n;
  char *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  n = (lua_Integer)luaL_checklstring(L,1,(size_t *)&s);
  lStack_30 = lua_tointegerx((lua_State *)len,2,(int *)0x0);
  lVar1 = lStack_30 + -1;
  if (lVar1 < 0) {
    lStack_30 = 0;
    lVar1 = lStack_30;
  }
  else if (lVar1 < (long)s) {
    while (lVar1 = lStack_30, ((int)*(char *)(n + lStack_30) & 0xc0U) == 0x80) {
      lStack_30 = lStack_30 + 1;
    }
  }
  lStack_30 = lVar1;
  if (lStack_30 < (long)s) {
    pcVar2 = utf8_decode((char *)(n + lStack_30),(int *)((long)&next + 4));
    if ((pcVar2 == (char *)0x0) || (((int)*pcVar2 & 0xc0U) == 0x80)) {
      L_local._4_4_ = luaL_error((lua_State *)len,"invalid UTF-8 code");
    }
    else {
      lua_pushinteger((lua_State *)len,lStack_30 + 1);
      lua_pushinteger((lua_State *)len,(long)next._4_4_);
      L_local._4_4_ = 2;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int iter_aux (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n = lua_tointeger(L, 2) - 1;
  if (n < 0)  /* first iteration? */
    n = 0;  /* start from here */
  else if (n < (lua_Integer)len) {
    n++;  /* skip current byte */
    while (iscont(s + n)) n++;  /* and its continuations */
  }
  if (n >= (lua_Integer)len)
    return 0;  /* no more codepoints */
  else {
    int code;
    const char *next = utf8_decode(s + n, &code);
    if (next == NULL || iscont(next))
      return luaL_error(L, "invalid UTF-8 code");
    lua_pushinteger(L, n + 1);
    lua_pushinteger(L, code);
    return 2;
  }
}